

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypePath.h
# Opt level: O0

TypePath * __thiscall
Js::TypePath::Branch<true>
          (TypePath *this,Recycler *recycler,int pathLength,bool couldSeeProto,
          ObjectSlotAttributes *attributes)

{
  RecyclerWeakReference<Js::DynamicObject> *pRVar1;
  code *pcVar2;
  byte bVar3;
  bool bVar4;
  BOOLEAN BVar5;
  byte bVar6;
  bool bVar7;
  undefined4 *puVar8;
  TypePath *this_00;
  PropertyRecord **ppPVar9;
  Data *pDVar10;
  RecyclerWeakReference<Js::DynamicObject> **ppRVar11;
  RecyclerWeakReference<Js::DynamicObject> *this_01;
  DynamicObject *pDVar12;
  PropertyRecord *this_02;
  char16 *pcVar13;
  ushort local_34;
  ushort local_32;
  PropertyIndex i_1;
  PropertyIndex i;
  TypePath *branchedPath;
  ObjectSlotAttributes *attributes_local;
  bool couldSeeProto_local;
  int pathLength_local;
  Recycler *recycler_local;
  TypePath *this_local;
  
  bVar3 = GetPathLength(this);
  if ((int)(uint)bVar3 <= pathLength) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0xca,"(pathLength < this->GetPathLength())",
                                "Why are we branching at the tip of the type path?");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  if (attributes == (ObjectSlotAttributes *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Types/TypePath.h"
                                ,0xcb,"(checkAttributes == (attributes != nullptr))",
                                "checkAttributes == (attributes != nullptr)");
    if (!bVar4) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    puVar8 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar8 = 0;
  }
  this_00 = New(recycler,pathLength + 1);
  for (local_32 = 0; (int)(uint)local_32 < pathLength; local_32 = local_32 + 1) {
    if (attributes[local_32] == ObjectSlotAttr_Setter) {
      ppPVar9 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                          ((WriteBarrierPtr *)(&this[1].data + local_32));
      AddInternal<false>(this_00,*ppPVar9);
    }
    else {
      ppPVar9 = Memory::WriteBarrierPtr::operator_cast_to_PropertyRecord__
                          ((WriteBarrierPtr *)(&this[1].data + local_32));
      AddInternal<true>(this_00,*ppPVar9);
    }
    if (couldSeeProto) {
      pDVar10 = GetData(this);
      BVar5 = BVStatic<128UL>::Test(&pDVar10->usedFixedFields,(uint)local_32);
      if (BVar5 == '\0') {
        pDVar10 = GetData(this);
        BVar5 = BVStatic<128UL>::Test(&pDVar10->fixedFields,(uint)local_32);
        if (BVar5 != '\0') {
          pDVar10 = GetData(this);
          BVStatic<128UL>::Clear(&pDVar10->fixedFields,(uint)local_32);
        }
      }
      else {
        pDVar10 = GetData(this_00);
        BVStatic<128UL>::Set(&pDVar10->usedFixedFields,(uint)local_32);
      }
    }
  }
  bVar3 = GetMaxInitializedLength(this);
  if ((int)(uint)bVar3 < pathLength) {
    SetMaxInitializedLength(this,pathLength);
  }
  SetMaxInitializedLength(this_00,pathLength);
  bVar4 = Phases::IsEnabled((Phases *)&DAT_01ec1678,FixMethodPropsPhase);
  if ((bVar4) && ((DAT_01ec73ca & 1) != 0)) {
    ppRVar11 = Memory::PointerValue<Memory::RecyclerWeakReference<Js::DynamicObject>>
                         (&this->singletonInstance);
    pRVar1 = *ppRVar11;
    this_01 = Memory::WriteBarrierPtr<Memory::RecyclerWeakReference<Js::DynamicObject>_>::operator->
                        (&this->singletonInstance);
    pDVar12 = Memory::RecyclerWeakReference<Js::DynamicObject>::Get(this_01);
    Output::Print(L"FixedFields: TypePath::Branch: singleton: 0x%p(0x%p)\n",pRVar1,pDVar12);
    Output::Print(L"   fixed fields:");
    for (local_34 = 0; bVar3 = GetPathLength(this), local_34 < bVar3; local_34 = local_34 + 1) {
      this_02 = GetPropertyId(this,(uint)local_34);
      pcVar13 = PropertyRecord::GetBuffer(this_02);
      bVar3 = GetMaxInitializedLength(this);
      bVar6 = GetPathLength(this);
      bVar4 = GetIsFixedFieldAt(this,local_34,(uint)bVar6);
      bVar6 = GetPathLength(this);
      bVar7 = GetIsUsedFixedFieldAt(this,local_34,(uint)bVar6);
      Output::Print(L" %s %d%d%d,",pcVar13,(ulong)(local_34 < bVar3),(ulong)bVar4,(ulong)bVar7);
    }
    Output::Print(L"\n");
  }
  return this_00;
}

Assistant:

TypePath * Branch(Recycler * recycler, int pathLength, bool couldSeeProto, ObjectSlotAttributes * attributes = nullptr)
        {
            AssertMsg(pathLength < this->GetPathLength(), "Why are we branching at the tip of the type path?");
            Assert(checkAttributes == (attributes != nullptr));

            // Ensure there is at least one free entry in the new path, so we can extend it.
            // TypePath::New will take care of aligning this appropriately.
            TypePath * branchedPath = TypePath::New(recycler, pathLength + 1);

            for (PropertyIndex i = 0; i < pathLength; i++)
            {
                if (checkAttributes && attributes[i] == ObjectSlotAttr_Setter)
                {
                    branchedPath->AddInternal<false>(assignments[i]);
                }
                else
                {
                    branchedPath->AddInternal<true>(assignments[i]);
                }

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
                if (couldSeeProto)
                {
                    if (this->GetData()->usedFixedFields.Test(i))
                    {
                        // We must conservatively copy all used as fixed bits if some prototype instance could also take
                        // this transition.  See comment in PathTypeHandlerBase::ConvertToSimpleDictionaryType.
                        // Yes, we could devise a more efficient way of copying bits 1 through pathLength, if performance of this
                        // code path proves important enough.
                        branchedPath->GetData()->usedFixedFields.Set(i);
                    }
                    else if (this->GetData()->fixedFields.Test(i))
                    {
                        // We must clear any fixed fields that are not also used as fixed if some prototype instance could also take
                        // this transition.  See comment in PathTypeHandlerBase::ConvertToSimpleDictionaryType.
                        this->GetData()->fixedFields.Clear(i);
                    }
                }
#endif

            }

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
            // When branching, we must ensure that fixed field values on the prefix shared by the two branches are always
            // consistent.  Hence, we can't leave any of them uninitialized, because they could later get initialized to
            // different values, by two different instances (one on the old branch and one on the new branch).  If that happened
            // and the instance from the old branch later switched to the new branch, it would magically gain a different set
            // of fixed properties!
            if (this->GetMaxInitializedLength() < pathLength)
            {
                this->SetMaxInitializedLength(pathLength);
            }
            branchedPath->SetMaxInitializedLength(pathLength);
#endif

#ifdef SUPPORT_FIXED_FIELDS_ON_PATH_TYPES
            if (PHASE_VERBOSE_TRACE1(FixMethodPropsPhase))
            {
                Output::Print(_u("FixedFields: TypePath::Branch: singleton: 0x%p(0x%p)\n"), PointerValue(this->singletonInstance), this->singletonInstance->Get());
                Output::Print(_u("   fixed fields:"));

                for (PropertyIndex i = 0; i < GetPathLength(); i++)
                {
                    Output::Print(_u(" %s %d%d%d,"), GetPropertyId(i)->GetBuffer(),
                        i < GetMaxInitializedLength() ? 1 : 0,
                        GetIsFixedFieldAt(i, GetPathLength()) ? 1 : 0,
                        GetIsUsedFixedFieldAt(i, GetPathLength()) ? 1 : 0);
                }

                Output::Print(_u("\n"));
            }
#endif

            return branchedPath;
        }